

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_expression.cpp
# Opt level: O0

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
duckdb::BoundColumnRefExpression::Deserialize(Deserializer *deserializer)

{
  undefined8 depth_00;
  LogicalType *this;
  Deserializer *in_RDI;
  ColumnBinding CVar2;
  unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
  result;
  unsigned_long depth;
  ColumnBinding binding;
  LogicalType return_type;
  pointer other;
  char *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  _Head_base<0UL,_duckdb::Expression_*,_false> this_00;
  char *in_stack_ffffffffffffff68;
  field_id_t in_stack_ffffffffffffff76;
  Deserializer *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffffb8;
  optional_idx in_stack_ffffffffffffffc0;
  idx_t iVar1;
  
  this_00._M_head_impl = (Expression *)in_RDI;
  Deserializer::ReadProperty<duckdb::LogicalType>
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff76,in_stack_ffffffffffffff68);
  CVar2 = Deserializer::ReadProperty<duckdb::ColumnBinding>
                    (in_RDI,(field_id_t)((ulong)in_stack_ffffffffffffff48 >> 0x30),
                     in_stack_ffffffffffffff40);
  iVar1 = CVar2.table_index;
  depth_00 = Deserializer::ReadPropertyWithDefault<unsigned_long>
                       ((Deserializer *)this_00._M_head_impl,(field_id_t)((ulong)in_RDI >> 0x30),
                        in_stack_ffffffffffffff48);
  this = (LogicalType *)operator_new(0x70);
  other = (pointer)&stack0xffffffffffffff90;
  LogicalType::LogicalType(this,(LogicalType *)other);
  CVar2.column_index = (idx_t)CVar2.column_index;
  CVar2.table_index = iVar1;
  BoundColumnRefExpression
            ((BoundColumnRefExpression *)in_stack_ffffffffffffffc0.index,
             (LogicalType *)in_stack_ffffffffffffffb8,CVar2,depth_00);
  unique_ptr<duckdb::BoundColumnRefExpression,std::default_delete<duckdb::BoundColumnRefExpression>,true>
  ::unique_ptr<std::default_delete<duckdb::BoundColumnRefExpression>,void>
            ((unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
              *)this,other);
  LogicalType::~LogicalType((LogicalType *)0xacfb14);
  unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
  unique_ptr<duckdb::BoundColumnRefExpression,std::default_delete<std::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>>>,void>
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)this,
             (unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
              *)other);
  unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
  ::~unique_ptr((unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                 *)0xacfb2d);
  LogicalType::~LogicalType((LogicalType *)0xacfb3a);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
         this_00._M_head_impl;
}

Assistant:

unique_ptr<Expression> BoundColumnRefExpression::Deserialize(Deserializer &deserializer) {
	auto return_type = deserializer.ReadProperty<LogicalType>(200, "return_type");
	auto binding = deserializer.ReadProperty<ColumnBinding>(201, "binding");
	auto depth = deserializer.ReadPropertyWithDefault<idx_t>(202, "depth");
	auto result = duckdb::unique_ptr<BoundColumnRefExpression>(new BoundColumnRefExpression(std::move(return_type), binding, depth));
	return std::move(result);
}